

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspif.c
# Opt level: O2

void make_dsp_instance(DspInterface dsp,char *lispbitmap,int width_hint,int height_hint,
                      int depth_hint)

{
  DspInterface pDVar1;
  
  pDVar1 = X_init(dsp,0,LispDisplayRequestedWidth,LispDisplayRequestedHeight,depth_hint);
  if (pDVar1 != (DspInterface)0x0) {
    return;
  }
  fwrite("Can\'t open display.",0x13,1,_stderr);
  exit(-1);
}

Assistant:

void make_dsp_instance(DspInterface dsp, char *lispbitmap, int width_hint, int height_hint,
                       int depth_hint) {
#ifdef DOS

  TPRINT(("Enter make_dsp_instance, dosdisplaymode is: %d\n", dosdisplaymode));

  if (depth_hint == 0) depth_hint = 1;

  switch (dosdisplaymode) {
    case 1: VGA_init(dsp, 0, 0, 0, depth_hint); break;
    case 0x102:
    case 0x104: VESA_init(dsp, 0, 0, 0, depth_hint); break;
    default:
      if (VESA_p()) {
        VESA_init(dsp, 0, 0, 0, depth_hint);
      } else if (VGA_p()) {
        VGA_init(dsp, 0, 0, 0, depth_hint);
      } else { /* Can't set *ANY* video mode! */
        (void)(void)fprintf(stderr, "No portable graphics mode supported by this host.\n");
        (void)(void)fprintf(stderr, "\n-Expected VESA or VGA.\n");
        exit(1);
      }
      break;
  }

#elif XWINDOW
  /* lispbitmap is 0 when we call X_init the first time. */
  if (X_init(dsp, 0, LispDisplayRequestedWidth, LispDisplayRequestedHeight, depth_hint) == NULL) {
    (void)fprintf(stderr, "Can't open display.");
    exit(-1);
  }
#endif /* DOS | XWINDOW */
}